

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O2

boolean jtransform_parse_crop_spec(jpeg_transform_info *info,char *spec)

{
  byte *pbVar1;
  byte bVar2;
  boolean bVar3;
  JCROP_CODE JVar4;
  ushort **ppuVar5;
  byte *local_18;
  
  info->crop = 0;
  info->crop_width_set = JCROP_UNSET;
  info->crop_height_set = JCROP_UNSET;
  info->crop_xoffset_set = JCROP_UNSET;
  info->crop_yoffset_set = JCROP_UNSET;
  local_18 = (byte *)spec;
  ppuVar5 = __ctype_b_loc();
  pbVar1 = (byte *)spec;
  if ((*(byte *)((long)*ppuVar5 + (long)*spec * 2 + 1) & 8) != 0) {
    bVar3 = jt_read_integer((char **)&local_18,&info->crop_width);
    if (bVar3 == 0) {
      return 0;
    }
    bVar2 = *local_18;
    if (bVar2 == 0x46) {
LAB_00104025:
      JVar4 = JCROP_FORCE;
LAB_0010402b:
      local_18 = local_18 + 1;
    }
    else {
      if ((bVar2 == 0x52) || (bVar2 == 0x72)) {
        JVar4 = JCROP_REFLECT;
        goto LAB_0010402b;
      }
      if (bVar2 == 0x66) goto LAB_00104025;
      JVar4 = JCROP_POS;
    }
    info->crop_width_set = JVar4;
    pbVar1 = local_18;
  }
  local_18 = pbVar1;
  bVar2 = *local_18;
  if ((bVar2 | 0x20) != 0x78) goto LAB_00104095;
  local_18 = local_18 + 1;
  bVar3 = jt_read_integer((char **)&local_18,&info->crop_height);
  if (bVar3 == 0) {
    return 0;
  }
  bVar2 = *local_18;
  if (bVar2 == 0x46) {
LAB_00104076:
    local_18 = local_18 + 1;
    JVar4 = JCROP_FORCE;
  }
  else if ((bVar2 == 0x52) || (bVar2 == 0x72)) {
    local_18 = local_18 + 1;
    JVar4 = JCROP_REFLECT;
  }
  else {
    if (bVar2 == 0x66) goto LAB_00104076;
    JVar4 = JCROP_POS;
  }
  info->crop_height_set = JVar4;
  bVar2 = *local_18;
LAB_00104095:
  if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
    info->crop_xoffset_set = (bVar2 == 0x2d) + JCROP_POS;
    local_18 = local_18 + 1;
    bVar3 = jt_read_integer((char **)&local_18,&info->crop_xoffset);
    if (bVar3 == 0) {
      return 0;
    }
    bVar2 = *local_18;
  }
  if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
    info->crop_yoffset_set = (bVar2 == 0x2d) + JCROP_POS;
    local_18 = local_18 + 1;
    bVar3 = jt_read_integer((char **)&local_18,&info->crop_yoffset);
    if (bVar3 == 0) {
      return 0;
    }
    bVar2 = *local_18;
  }
  if (bVar2 != 0) {
    return 0;
  }
  info->crop = 1;
  return 1;
}

Assistant:

GLOBAL(boolean)
jtransform_parse_crop_spec(jpeg_transform_info *info, const char *spec)
{
  info->crop = FALSE;
  info->crop_width_set = JCROP_UNSET;
  info->crop_height_set = JCROP_UNSET;
  info->crop_xoffset_set = JCROP_UNSET;
  info->crop_yoffset_set = JCROP_UNSET;

  if (isdigit(*spec)) {
    /* fetch width */
    if (!jt_read_integer(&spec, &info->crop_width))
      return FALSE;
    if (*spec == 'f' || *spec == 'F') {
      spec++;
      info->crop_width_set = JCROP_FORCE;
    } else if (*spec == 'r' || *spec == 'R') {
      spec++;
      info->crop_width_set = JCROP_REFLECT;
    } else
      info->crop_width_set = JCROP_POS;
  }
  if (*spec == 'x' || *spec == 'X') {
    /* fetch height */
    spec++;
    if (!jt_read_integer(&spec, &info->crop_height))
      return FALSE;
    if (*spec == 'f' || *spec == 'F') {
      spec++;
      info->crop_height_set = JCROP_FORCE;
    } else if (*spec == 'r' || *spec == 'R') {
      spec++;
      info->crop_height_set = JCROP_REFLECT;
    } else
      info->crop_height_set = JCROP_POS;
  }
  if (*spec == '+' || *spec == '-') {
    /* fetch xoffset */
    info->crop_xoffset_set = (*spec == '-') ? JCROP_NEG : JCROP_POS;
    spec++;
    if (!jt_read_integer(&spec, &info->crop_xoffset))
      return FALSE;
  }
  if (*spec == '+' || *spec == '-') {
    /* fetch yoffset */
    info->crop_yoffset_set = (*spec == '-') ? JCROP_NEG : JCROP_POS;
    spec++;
    if (!jt_read_integer(&spec, &info->crop_yoffset))
      return FALSE;
  }
  /* We had better have gotten to the end of the string. */
  if (*spec != '\0')
    return FALSE;
  info->crop = TRUE;
  return TRUE;
}